

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O1

bool __thiscall
wasm::EquivalentClass::deriveParams
          (EquivalentClass *this,Module *module,
          vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *params,
          bool isCallIndirectionEnabled)

{
  pointer *this_00;
  ParamInfo *this_01;
  char *pcVar1;
  Function *pFVar2;
  Expression *pEVar3;
  char *pcVar4;
  char *pcVar5;
  pointer pPVar6;
  pointer pppEVar7;
  char *pcVar8;
  DeepValueIterator *pDVar9;
  undefined1 auVar10 [8];
  char cVar11;
  pointer pDVar12;
  bool bVar13;
  ulong uVar14;
  DeepValueIterator *pDVar15;
  Expression **ppEVar16;
  undefined7 in_register_00000009;
  ParamInfo *param;
  long lVar17;
  ulong uVar18;
  Literal *other;
  pointer pPVar19;
  DeepValueIterator *pDVar20;
  DeepValueIterator *pDVar21;
  pointer ppFVar22;
  byte bVar23;
  undefined1 auVar24 [8];
  initializer_list<wasm::Expression_**> __l;
  _Variant_storage<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
  local_230;
  undefined1 local_1f0 [8];
  DeepValueIterator primaryIt;
  void *local_140;
  long local_130;
  undefined1 auStack_128 [8];
  ConstDiff diff;
  Literals values;
  long local_a0;
  vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *__range2;
  bool __ret;
  vector<wasm::Name,_std::allocator<wasm::Name>_> names;
  undefined1 auStack_58 [8];
  vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> siblingIterators;
  allocator_type local_35;
  uint local_34;
  
  bVar23 = 0;
  pcVar1 = (this->primaryFunction->super_Importable).module.super_IString.str._M_str;
  if (pcVar1 == (char *)0x0) {
    uVar14 = CONCAT71(in_register_00000009,isCallIndirectionEnabled) & 0xffffffff;
    deriveParams(wasm::Module*,std::vector<wasm::ParamInfo,std::allocator<wasm::ParamInfo>>&,bool)::
    DeepValueIterator::DeepValueIterator(wasm::Expression___(local_1f0,&this->primaryFunction->body)
    ;
    auStack_58 = (undefined1  [8])0x0;
    siblingIterators.super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    siblingIterators.super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppFVar22 = (this->functions).
               super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->functions).
                      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppFVar22) < 9) {
      __assert_fail("functions.size() >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                    ,0x178,
                    "bool wasm::EquivalentClass::deriveParams(Module *, std::vector<ParamInfo> &, bool)"
                   );
    }
    ppFVar22 = ppFVar22 + 1;
    if (ppFVar22 !=
        (this->functions).super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_34 = (uint)CONCAT71(in_register_00000009,isCallIndirectionEnabled);
      names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)this;
      do {
        pDVar12 = siblingIterators.
                  super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
                  super__Vector_impl_data._M_start;
        auVar24 = auStack_58;
        pFVar2 = *ppFVar22;
        if (siblingIterators.
            super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
            super__Vector_impl_data._M_start ==
            siblingIterators.
            super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          if ((long)siblingIterators.
                    super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)auStack_58 ==
              0x7fffffffffffffc0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          lVar17 = (long)siblingIterators.
                         super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
                         _M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 4;
          uVar18 = lVar17 * 0x6db6db6db6db6db7;
          uVar14 = uVar18;
          if ((undefined1  [8])
              siblingIterators.
              super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
              super__Vector_impl_data._M_start == auStack_58) {
            uVar14 = 1;
          }
          siblingIterators.super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(uVar14 + uVar18);
          if ((pointer)0x124924924924923 <
              siblingIterators.
              super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            siblingIterators.
            super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x124924924924924;
          }
          if (CARRY8(uVar14,uVar18)) {
            siblingIterators.
            super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x124924924924924;
          }
          if (siblingIterators.
              super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
            pDVar15 = (DeepValueIterator *)0x0;
          }
          else {
            pDVar15 = (DeepValueIterator *)
                      operator_new((long)siblingIterators.
                                         super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage * 0x70);
          }
          deriveParams(wasm::Module*,std::vector<wasm::ParamInfo,std::allocator<wasm::
          ParamInfo>>&,bool)::DeepValueIterator::DeepValueIterator(wasm::Expression___
                    ((pDVar15->tasks).fixed._M_elems + lVar17 * 2 + -1,&pFVar2->body);
          pDVar9 = pDVar15;
          for (auVar10 = auVar24; (undefined1  [8])pDVar12 != auVar10;
              auVar10 = (undefined1  [8])((long)auVar10 + 0x70)) {
            pDVar20 = (DeepValueIterator *)auVar10;
            pDVar21 = pDVar9;
            for (lVar17 = 0xb; lVar17 != 0; lVar17 = lVar17 + -1) {
              (pDVar21->tasks).usedFixed = (pDVar20->tasks).usedFixed;
              pDVar20 = (DeepValueIterator *)((long)pDVar20 + (ulong)bVar23 * -0x10 + 8);
              pDVar21 = (DeepValueIterator *)((long)pDVar21 + (ulong)bVar23 * -0x10 + 8);
            }
            pppEVar7 = (((DeepValueIterator *)auVar10)->tasks).flexible.
                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            (pDVar9->tasks).flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (((DeepValueIterator *)auVar10)->tasks).flexible.
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (pDVar9->tasks).flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_finish = pppEVar7;
            (pDVar9->tasks).flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (((DeepValueIterator *)auVar10)->tasks).flexible.
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            (((DeepValueIterator *)auVar10)->tasks).flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (((DeepValueIterator *)auVar10)->tasks).flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (((DeepValueIterator *)auVar10)->tasks).flexible.
            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pDVar9 = pDVar9 + 1;
          }
          if (auVar24 != (undefined1  [8])0x0) {
            operator_delete((void *)auVar24,
                            (long)siblingIterators.
                                  super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)auVar24);
          }
          siblingIterators.super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               pDVar15 + (long)siblingIterators.
                               super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          auStack_58 = (undefined1  [8])pDVar15;
        }
        else {
          deriveParams(wasm::Module*,std::vector<wasm::ParamInfo,std::allocator<wasm::
          ParamInfo>>&,bool)::DeepValueIterator::DeepValueIterator(wasm::Expression___
                    (siblingIterators.
                     super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
                     _M_impl.super__Vector_impl_data._M_start,&pFVar2->body);
          pDVar9 = pDVar12;
        }
        siblingIterators.super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
        _M_impl.super__Vector_impl_data._M_start = pDVar9 + 1;
        ppFVar22 = ppFVar22 + 1;
        uVar14 = (ulong)local_34;
      } while (ppFVar22 !=
               (pointer)names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage[1].super_IString.str._M_len);
    }
    uVar14 = uVar14 ^ 1;
    local_34 = (uint)uVar14;
    while (((long)primaryIt.tasks.flexible.
                  super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                  _M_impl.super__Vector_impl_data._M_start - (long)primaryIt.tasks.fixed._M_elems[9]
           >> 3) + (long)local_1f0 != 0) {
      siblingIterators.super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)deriveParams::DeepValueIterator::operator*((DeepValueIterator *)local_1f0);
      pDVar12 = siblingIterators.
                super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
                super__Vector_impl_data._M_start;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._M_first.
      _M_storage._M_storage[0x28] = '\0';
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._41_8_ = 0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._24_8_ = 0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._M_first.
      _M_storage._M_storage[0x20] = '\0';
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._33_7_ = 0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._8_8_ = 0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._16_8_ = 0;
      auStack_128 = (undefined1  [8])0x0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_u._0_8_ = 0;
      values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
      values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
      _M_str = (char *)0x0;
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._M_index = '\0';
      diff.
      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>.
      super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>._57_7_ = 0;
      values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
      names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ___ret = (pointer)0x0;
      names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      pEVar3 = (Expression *)
               ((siblingIterators.
                 super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage)->tasks).usedFixed;
      if (pEVar3->_id == ConstId) {
        SmallVector<wasm::Literal,_1UL>::push_back
                  ((SmallVector<wasm::Literal,_1UL> *)
                   ((long)&diff.
                           super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                           .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_> +
                   0x38),(Literal *)(pEVar3 + 1));
        names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)siblingIterators.
                      super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        bVar23 = 1;
        auVar24 = auStack_58;
        if (auStack_58 !=
            (undefined1  [8])
            siblingIterators.
            super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>._M_impl.
            super__Vector_impl_data._M_start) {
          do {
            ppEVar16 = deriveParams::DeepValueIterator::operator*((DeepValueIterator *)auVar24);
            deriveParams::DeepValueIterator::operator++((DeepValueIterator *)auVar24);
            if ((*ppEVar16)->_id != ConstId) {
              handle_unreachable("all sibling functions should have the same instruction type",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                                 ,0x18e);
            }
            other = (Literal *)(*ppEVar16 + 1);
            bVar13 = Literal::operator==((Literal *)(pEVar3 + 1),other);
            SmallVector<wasm::Literal,_1UL>::push_back
                      ((SmallVector<wasm::Literal,_1UL> *)
                       ((long)&diff.
                               super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                               .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                               super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                               super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                               super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                               super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>
                       + 0x38),other);
            bVar23 = bVar23 & bVar13;
            auVar24 = (undefined1  [8])((long)auVar24 + 0x70);
          } while (auVar24 !=
                   (undefined1  [8])
                   names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
        }
        std::variant<wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>>::operator=
                  ((variant<wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>> *)
                   auStack_128,
                   (Literals *)
                   ((long)&diff.
                           super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                           .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                           super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_> +
                   0x38));
LAB_007ba7c6:
        if (bVar23 == 0) {
          pPVar19 = (params->super__Vector_base<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pPVar6 = (params->super__Vector_base<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          if (pPVar19 != pPVar6) {
            bVar13 = false;
            do {
              __range2 = (vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *)
                         CONCAT71(__range2._1_7_,1);
              primaryIt.tasks.flexible.
              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)&__range2;
              (*std::__detail::__variant::
                __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>_&>
                ::_S_vtable._M_arr
                [(long)(char)diff.
                             super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                             .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                             super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                             super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                             super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                             super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                             _M_u._M_first._M_storage._M_storage[0x30] + 1]._M_data)
                        ((anon_class_16_2_9763bfdf_conflict1 *)
                         &primaryIt.tasks.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (variant<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                          *)auStack_128);
              cVar11 = (char)__range2;
              if ((char)__range2 == '\x01') {
                primaryIt.tasks.flexible.
                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)siblingIterators.
                              super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage;
                std::vector<wasm::Expression**,std::allocator<wasm::Expression**>>::
                emplace_back<wasm::Expression**>
                          ((vector<wasm::Expression**,std::allocator<wasm::Expression**>> *)
                           &pPVar19->uses,
                           (Expression ***)
                           &primaryIt.tasks.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                bVar13 = true;
              }
            } while ((cVar11 == '\0') && (pPVar19 = pPVar19 + 1, pPVar19 != pPVar6));
            if (bVar13) goto LAB_007ba8f9;
          }
          std::__detail::__variant::
          _Copy_ctor_base<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
          ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                             *)&local_230,
                            (_Copy_ctor_base<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                             *)auStack_128);
          __range2 = (vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_> *)
                     siblingIterators.
                     super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          this_00 = &values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          __l._M_len = 1;
          __l._M_array = (iterator)&__range2;
          std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::vector
                    ((vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)this_00,
                     __l,&local_35);
          this_01 = (ParamInfo *)
                    &primaryIt.tasks.flexible.
                     super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
          ParamInfo::ParamInfo
                    (this_01,(ConstDiff *)&local_230,
                     (vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)this_00);
          std::vector<wasm::ParamInfo,_std::allocator<wasm::ParamInfo>_>::
          emplace_back<wasm::ParamInfo>(params,this_01);
          if (local_140 != (void *)0x0) {
            operator_delete(local_140,local_130 - (long)local_140);
          }
          std::__detail::__variant::
          _Variant_storage<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
          ::~_Variant_storage((_Variant_storage<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                               *)this_01);
          if (values.super_SmallVector<wasm::Literal,_1UL>.flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            operator_delete(values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                            local_a0 -
                            (long)values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          std::__detail::__variant::
          _Variant_storage<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
          ::~_Variant_storage(&local_230);
        }
      }
      else {
        auVar24 = auStack_58;
        if (pEVar3->_id == CallId && (char)uVar14 == '\0') {
          std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                    ((vector<wasm::Name,std::allocator<wasm::Name>> *)&__ret,(iterator)0x0,
                     (Name *)(pEVar3 + 3));
          pDVar12 = siblingIterators.
                    super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          bVar23 = 1;
          names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)pEVar3;
          for (auVar24 = auStack_58; auVar24 != (undefined1  [8])pDVar12;
              auVar24 = (undefined1  [8])((long)auVar24 + 0x70)) {
            ppEVar16 = deriveParams::DeepValueIterator::operator*((DeepValueIterator *)auVar24);
            deriveParams::DeepValueIterator::operator++((DeepValueIterator *)auVar24);
            pEVar3 = *ppEVar16;
            if (pEVar3->_id != CallId) {
              handle_unreachable("all sibling functions should have the same instruction type",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                                 ,0x19d);
            }
            pcVar4 = names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage[3].super_IString.str._M_str;
            pcVar5 = (char *)pEVar3[3].type.id;
            if (names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start ==
                names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<wasm::Name,std::allocator<wasm::Name>>::
              _M_realloc_insert<wasm::Name_const&>
                        ((vector<wasm::Name,std::allocator<wasm::Name>> *)&__ret,
                         (iterator)
                         names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                         super__Vector_impl_data._M_start,(Name *)(pEVar3 + 3));
            }
            else {
              pcVar8 = (char *)pEVar3[3].type.id;
              ((names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start)->super_IString).str._M_len =
                   *(size_t *)(pEVar3 + 3);
              ((names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start)->super_IString).str._M_str = pcVar8;
              names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start =
                   names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
            bVar23 = bVar23 & pcVar4 == pcVar5;
          }
          std::variant<wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>>::operator=
                    ((variant<wasm::Literals,std::vector<wasm::Name,std::allocator<wasm::Name>>> *)
                     auStack_128,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__ret);
          goto LAB_007ba7c6;
        }
        for (; auVar24 != (undefined1  [8])pDVar12;
            auVar24 = (undefined1  [8])((long)auVar24 + 0x70)) {
          ppEVar16 = deriveParams::DeepValueIterator::operator*((DeepValueIterator *)auVar24);
          if ((*ppEVar16)->_id !=
              *(Id *)((siblingIterators.
                       super__Vector_base<DeepValueIterator,_std::allocator<DeepValueIterator>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage)->tasks).usedFixed) {
            __assert_fail("(*it)->_id == primary->_id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                          ,0x1a6,
                          "bool wasm::EquivalentClass::deriveParams(Module *, std::vector<ParamInfo> &, bool)"
                         );
          }
          deriveParams::DeepValueIterator::operator++((DeepValueIterator *)auVar24);
        }
      }
LAB_007ba8f9:
      if (___ret != (pointer)0x0) {
        operator_delete(___ret,(long)names.
                                     super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)___ret);
      }
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                 &values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
      Literal::~Literal((Literal *)&values);
      std::__detail::__variant::
      _Variant_storage<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
      ::~_Variant_storage((_Variant_storage<false,_wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                           *)auStack_128);
      deriveParams::DeepValueIterator::operator++((DeepValueIterator *)local_1f0);
      uVar14 = (ulong)local_34;
    }
    std::vector<DeepValueIterator,_std::allocator<DeepValueIterator>_>::~vector
              ((vector<DeepValueIterator,_std::allocator<DeepValueIterator>_> *)auStack_58);
    if (primaryIt.tasks.fixed._M_elems[9] != (Expression **)0x0) {
      operator_delete(primaryIt.tasks.fixed._M_elems[9],
                      (long)primaryIt.tasks.flexible.
                            super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)primaryIt.tasks.fixed._M_elems[9]);
    }
  }
  return pcVar1 == (char *)0x0;
}

Assistant:

bool EquivalentClass::deriveParams(Module* module,
                                   std::vector<ParamInfo>& params,
                                   bool isCallIndirectionEnabled) {
  // Allows iteration over children of the root expression recursively.
  struct DeepValueIterator {
    // The DFS work list.
    SmallVector<Expression**, 10> tasks;

    DeepValueIterator(Expression** root) { tasks.push_back(root); }

    void operator++() {
      ChildIterator it(*tasks.back());
      tasks.pop_back();
      for (Expression*& child : it) {
        tasks.push_back(&child);
      }
    }

    Expression*& operator*() {
      assert(!empty());
      return *tasks.back();
    }
    bool empty() { return tasks.empty(); }
  };

  if (primaryFunction->imported()) {
    return false;
  }
  DeepValueIterator primaryIt(&primaryFunction->body);
  std::vector<DeepValueIterator> siblingIterators;
  // Skip the first function, as it is the primary function to compare the
  // primary function with the other functions based on the primary instr type.
  assert(functions.size() >= 2);
  for (auto func = functions.begin() + 1; func != functions.end(); ++func) {
    siblingIterators.emplace_back(&(*func)->body);
  }

  for (; !primaryIt.empty(); ++primaryIt) {
    Expression*& primary = *primaryIt;
    ConstDiff diff;
    Literals values;
    std::vector<Name> names;

    bool isAllSame = true;
    if (auto* primaryConst = primary->dynCast<Const>()) {
      values.push_back(primaryConst->value);
      for (auto& it : siblingIterators) {
        Expression*& sibling = *it;
        ++it;
        if (auto* siblingConst = sibling->dynCast<Const>()) {
          isAllSame &= primaryConst->value == siblingConst->value;
          values.push_back(siblingConst->value);
        } else {
          WASM_UNREACHABLE(
            "all sibling functions should have the same instruction type");
        }
      }
      diff = values;
    } else if (isCallIndirectionEnabled && primary->is<Call>()) {
      auto* primaryCall = primary->dynCast<Call>();
      names.push_back(primaryCall->target);
      for (auto& it : siblingIterators) {
        Expression*& sibling = *it;
        ++it;
        if (auto* siblingCall = sibling->dynCast<Call>()) {
          isAllSame &= primaryCall->target == siblingCall->target;
          names.push_back(siblingCall->target);
        } else {
          WASM_UNREACHABLE(
            "all sibling functions should have the same instruction type");
        }
      }
      diff = names;
    } else {
      // Skip non-constant expressions, which are ensured to be the exactly
      // same.
      for (auto& it : siblingIterators) {
        // Sibling functions in a class should have the same instruction type.
        assert((*it)->_id == primary->_id);
        ++it;
      }
      continue;
    }
    // If all values are the same, skip to parameterize it.
    if (isAllSame) {
      continue;
    }
    // If the derived param is already in the params, reuse it.
    // e.g.
    //
    // ```
    // (func $use-42-twice (result i32)
    //   (i32.add (i32.const 42) (i32.const 42))
    // )
    // (func $use-43-twice (result i32)
    //   (i32.add (i32.const 43) (i32.const 43))
    // )
    // ```
    //
    // will be merged reusing the parameter [42, 43]
    //
    // ```
    // (func $use-42-twice (result i32)
    //  (call $byn$mgfn-shared$use-42-twice (i32.const 42))
    // )
    // (func $use-43-twice (result i32)
    //  (call $byn$mgfn-shared$use-42-twice (i32.const 43))
    // )
    // (func $byn$mgfn-shared$use-42-twice (param $0 i32) (result i32)
    //  (i32.add (local.get $0) (local.get $0))
    // )
    // ```
    //
    bool paramReused = false;
    for (auto& param : params) {
      if (param.values == diff) {
        param.uses.push_back(&primary);
        paramReused = true;
        break;
      }
    }
    if (!paramReused) {
      params.push_back(ParamInfo(diff, {&primary}));
    }
  }
  return true;
}